

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O2

int64_t av1_highbd_pixel_proj_error_sse4_1
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  ushort *puVar1;
  int *piVar2;
  int *piVar3;
  ushort *puVar4;
  int *piVar5;
  int *piVar6;
  ushort *puVar7;
  ushort uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ushort *puVar14;
  int iVar15;
  ushort *puVar16;
  ushort *puVar17;
  int *piVar18;
  int *piVar19;
  ushort *puVar20;
  long lVar21;
  long lVar22;
  uint uVar24;
  undefined1 auVar23 [16];
  uint uVar25;
  undefined1 in_XMM3 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  puVar17 = (ushort *)((long)src8 * 2);
  puVar20 = (ushort *)((long)dat8 * 2);
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      lVar9 = 0;
      if (height < 1) {
        height = 0;
      }
      lVar21 = 0;
      lVar22 = 0;
      for (iVar15 = 0; iVar15 != height; iVar15 = iVar15 + 1) {
        auVar27 = (undefined1  [16])0x0;
        lVar12 = 0;
        puVar14 = puVar20;
        puVar16 = puVar17;
        while( true ) {
          uVar24 = auVar27._8_4_;
          uVar25 = auVar27._12_4_;
          if (width + -0x10 < lVar12) break;
          puVar1 = puVar17 + lVar12;
          puVar7 = puVar17 + lVar12 + 8;
          puVar4 = puVar20 + lVar12;
          auVar29._0_2_ = *puVar4 - *puVar1;
          auVar29._2_2_ = puVar4[1] - puVar1[1];
          auVar29._4_2_ = puVar4[2] - puVar1[2];
          auVar29._6_2_ = puVar4[3] - puVar1[3];
          auVar29._8_2_ = puVar4[4] - puVar1[4];
          auVar29._10_2_ = puVar4[5] - puVar1[5];
          auVar29._12_2_ = puVar4[6] - puVar1[6];
          auVar29._14_2_ = puVar4[7] - puVar1[7];
          puVar1 = puVar20 + lVar12 + 8;
          auVar26._0_2_ = *puVar1 - *puVar7;
          auVar26._2_2_ = puVar1[1] - puVar7[1];
          auVar26._4_2_ = puVar1[2] - puVar7[2];
          auVar26._6_2_ = puVar1[3] - puVar7[3];
          auVar26._8_2_ = puVar1[4] - puVar7[4];
          auVar26._10_2_ = puVar1[5] - puVar7[5];
          auVar26._12_2_ = puVar1[6] - puVar7[6];
          auVar26._14_2_ = puVar1[7] - puVar7[7];
          auVar29 = pmaddwd(auVar29,auVar29);
          in_XMM3 = pmaddwd(auVar26,auVar26);
          iVar11 = auVar27._4_4_;
          auVar27._0_4_ = auVar29._0_4_ + auVar27._0_4_ + in_XMM3._0_4_;
          auVar27._4_4_ = auVar29._4_4_ + iVar11 + in_XMM3._4_4_;
          auVar27._8_4_ = auVar29._8_4_ + uVar24 + in_XMM3._8_4_;
          auVar27._12_4_ = auVar29._12_4_ + uVar25 + in_XMM3._12_4_;
          lVar12 = lVar12 + 0x10;
          puVar16 = puVar16 + 0x10;
          puVar14 = puVar14 + 0x10;
        }
        in_XMM3 = pmovzxdq(in_XMM3,auVar27);
        for (; lVar12 < width; lVar12 = lVar12 + 1) {
          lVar9 = lVar9 + ((ulong)*puVar14 - (ulong)*puVar16) * ((ulong)*puVar14 - (ulong)*puVar16);
          puVar16 = puVar16 + 1;
          puVar14 = puVar14 + 1;
        }
        lVar21 = lVar21 + in_XMM3._0_8_ + (ulong)uVar24;
        lVar22 = lVar22 + in_XMM3._8_8_ + (ulong)uVar25;
        puVar20 = puVar20 + dat_stride;
        puVar17 = puVar17 + src_stride;
      }
      goto LAB_0039ed29;
    }
    lVar9 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
  }
  else {
    if (0 < params->r[1]) {
      iVar15 = *xq;
      iVar11 = xq[1];
      auVar35._4_4_ = iVar15;
      auVar35._0_4_ = iVar15;
      auVar35._8_4_ = iVar15;
      auVar35._12_4_ = iVar15;
      auVar23._4_4_ = iVar11;
      auVar23._0_4_ = iVar11;
      auVar23._8_4_ = iVar11;
      auVar23._12_4_ = iVar11;
      if (height < 1) {
        height = 0;
      }
      auVar27 = pmovsxwd(in_XMM4,0x400040004000400);
      lVar9 = 0;
      lVar21 = 0;
      lVar22 = 0;
      for (iVar10 = 0; iVar10 != height; iVar10 = iVar10 + 1) {
        lVar12 = 0;
        puVar14 = puVar17;
        puVar16 = puVar20;
        piVar18 = flt0;
        piVar19 = flt1;
        auVar26 = (undefined1  [16])0x0;
        while( true ) {
          if (width + -8 < lVar12) break;
          puVar1 = puVar17 + lVar12;
          auVar29 = *(undefined1 (*) [16])(puVar20 + lVar12);
          auVar34 = psllw(auVar29,4);
          in_XMM10 = pmovzxwd(in_XMM10,auVar34);
          piVar2 = flt0 + lVar12;
          piVar5 = flt0 + lVar12 + 4;
          piVar3 = flt1 + lVar12;
          piVar6 = flt1 + lVar12 + 4;
          auVar36._0_4_ = *piVar2 - in_XMM10._0_4_;
          auVar36._4_4_ = piVar2[1] - in_XMM10._4_4_;
          auVar36._8_4_ = piVar2[2] - in_XMM10._8_4_;
          auVar36._12_4_ = piVar2[3] - in_XMM10._12_4_;
          auVar40._0_4_ = *piVar5 - (uint)auVar34._8_2_;
          auVar40._4_4_ = piVar5[1] - (uint)auVar34._10_2_;
          auVar40._8_4_ = piVar5[2] - (uint)auVar34._12_2_;
          auVar40._12_4_ = piVar5[3] - (uint)auVar34._14_2_;
          auVar31._0_4_ = *piVar3 - in_XMM10._0_4_;
          auVar31._4_4_ = piVar3[1] - in_XMM10._4_4_;
          auVar31._8_4_ = piVar3[2] - in_XMM10._8_4_;
          auVar31._12_4_ = piVar3[3] - in_XMM10._12_4_;
          auVar42._0_4_ = *piVar6 - (uint)auVar34._8_2_;
          auVar42._4_4_ = piVar6[1] - (uint)auVar34._10_2_;
          auVar42._8_4_ = piVar6[2] - (uint)auVar34._12_2_;
          auVar42._12_4_ = piVar6[3] - (uint)auVar34._14_2_;
          auVar37 = pmulld(auVar36,auVar35);
          auVar41 = pmulld(auVar40,auVar35);
          auVar34 = pmulld(auVar31,auVar23);
          auVar43 = pmulld(auVar42,auVar23);
          auVar32._0_4_ = auVar34._0_4_ + auVar37._0_4_ + auVar27._0_4_ >> 0xb;
          auVar32._4_4_ = auVar34._4_4_ + auVar37._4_4_ + auVar27._4_4_ >> 0xb;
          auVar32._8_4_ = auVar34._8_4_ + auVar37._8_4_ + auVar27._8_4_ >> 0xb;
          auVar32._12_4_ = auVar34._12_4_ + auVar37._12_4_ + auVar27._12_4_ >> 0xb;
          auVar44._0_4_ = auVar43._0_4_ + auVar41._0_4_ + auVar27._0_4_ >> 0xb;
          auVar44._4_4_ = auVar43._4_4_ + auVar41._4_4_ + auVar27._4_4_ >> 0xb;
          auVar44._8_4_ = auVar43._8_4_ + auVar41._8_4_ + auVar27._8_4_ >> 0xb;
          auVar44._12_4_ = auVar43._12_4_ + auVar41._12_4_ + auVar27._12_4_ >> 0xb;
          auVar34 = packssdw(auVar32,auVar44);
          auVar30._0_2_ = (auVar29._0_2_ - *puVar1) + auVar34._0_2_;
          auVar30._2_2_ = (auVar29._2_2_ - puVar1[1]) + auVar34._2_2_;
          auVar30._4_2_ = (auVar29._4_2_ - puVar1[2]) + auVar34._4_2_;
          auVar30._6_2_ = (auVar29._6_2_ - puVar1[3]) + auVar34._6_2_;
          auVar30._8_2_ = (auVar29._8_2_ - puVar1[4]) + auVar34._8_2_;
          auVar30._10_2_ = (auVar29._10_2_ - puVar1[5]) + auVar34._10_2_;
          auVar30._12_2_ = (auVar29._12_2_ - puVar1[6]) + auVar34._12_2_;
          auVar30._14_2_ = (auVar29._14_2_ - puVar1[7]) + auVar34._14_2_;
          in_XMM6 = pmaddwd(auVar30,auVar30);
          auVar28._0_4_ = auVar26._0_4_ + in_XMM6._0_4_;
          auVar28._4_4_ = auVar26._4_4_ + in_XMM6._4_4_;
          auVar28._8_4_ = auVar26._8_4_ + in_XMM6._8_4_;
          auVar28._12_4_ = auVar26._12_4_ + in_XMM6._12_4_;
          lVar12 = lVar12 + 8;
          puVar14 = puVar14 + 8;
          piVar19 = piVar19 + 8;
          piVar18 = piVar18 + 8;
          puVar16 = puVar16 + 8;
          auVar26 = auVar28;
        }
        in_XMM6 = pmovzxdq(in_XMM6,auVar26);
        for (; lVar12 < width; lVar12 = lVar12 + 1) {
          uVar8 = *puVar16;
          lVar13 = (long)(int)(((uint)uVar8 - (uint)*puVar14) +
                              ((int)((*piVar18 + (uint)uVar8 * -0x10) * iVar15 +
                                     (*piVar19 + (uint)uVar8 * -0x10) * iVar11 + 0x400) >> 0xb));
          lVar9 = lVar9 + lVar13 * lVar13;
          puVar14 = puVar14 + 1;
          piVar19 = piVar19 + 1;
          piVar18 = piVar18 + 1;
          puVar16 = puVar16 + 1;
        }
        lVar21 = lVar21 + in_XMM6._0_8_ + (ulong)auVar26._8_4_;
        lVar22 = lVar22 + in_XMM6._8_8_ + (ulong)auVar26._12_4_;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        puVar20 = puVar20 + dat_stride;
        puVar17 = puVar17 + src_stride;
      }
      goto LAB_0039ed29;
    }
    lVar9 = 0;
  }
  iVar15 = *(int *)((long)xq + lVar9);
  auVar34._4_4_ = iVar15;
  auVar34._0_4_ = iVar15;
  auVar34._8_4_ = iVar15;
  auVar34._12_4_ = iVar15;
  iVar11 = iVar15 * -0x10;
  auVar37._4_4_ = iVar11;
  auVar37._0_4_ = iVar11;
  auVar37._8_4_ = iVar11;
  auVar37._12_4_ = iVar11;
  lVar9 = 0;
  if (height < 1) {
    height = 0;
  }
  auVar27 = pmovsxwd(in_XMM4,0x400040004000400);
  lVar21 = 0;
  lVar22 = 0;
  for (iVar11 = 0; iVar11 != height; iVar11 = iVar11 + 1) {
    lVar12 = 0;
    puVar14 = puVar20;
    piVar18 = flt0;
    puVar16 = puVar17;
    auVar26 = (undefined1  [16])0x0;
    while( true ) {
      if (width + -8 < lVar12) break;
      puVar1 = puVar17 + lVar12;
      auVar29 = *(undefined1 (*) [16])(puVar20 + lVar12);
      auVar33._2_2_ = 0;
      auVar33._0_2_ = auVar29._8_2_;
      auVar33._4_2_ = auVar29._10_2_;
      auVar33._6_2_ = 0;
      auVar33._8_2_ = auVar29._12_2_;
      auVar33._10_2_ = 0;
      auVar33._12_2_ = auVar29._14_2_;
      auVar33._14_2_ = 0;
      auVar43 = pmovzxwd(in_XMM9,auVar29);
      auVar38 = pmulld(*(undefined1 (*) [16])(flt0 + lVar12 + 4),auVar34);
      auVar35 = pmulld(*(undefined1 (*) [16])(flt0 + lVar12),auVar34);
      auVar41 = pmulld(auVar33,auVar37);
      in_XMM9 = pmulld(auVar43,auVar37);
      auVar39._0_4_ = auVar38._0_4_ + auVar27._0_4_ + auVar41._0_4_ >> 0xb;
      auVar39._4_4_ = auVar38._4_4_ + auVar27._4_4_ + auVar41._4_4_ >> 0xb;
      auVar39._8_4_ = auVar38._8_4_ + auVar27._8_4_ + auVar41._8_4_ >> 0xb;
      auVar39._12_4_ = auVar38._12_4_ + auVar27._12_4_ + auVar41._12_4_ >> 0xb;
      auVar38._0_4_ = auVar35._0_4_ + auVar27._0_4_ + in_XMM9._0_4_ >> 0xb;
      auVar38._4_4_ = auVar35._4_4_ + auVar27._4_4_ + in_XMM9._4_4_ >> 0xb;
      auVar38._8_4_ = auVar35._8_4_ + auVar27._8_4_ + in_XMM9._8_4_ >> 0xb;
      auVar38._12_4_ = auVar35._12_4_ + auVar27._12_4_ + in_XMM9._12_4_ >> 0xb;
      auVar41 = packssdw(auVar38,auVar39);
      auVar43._0_2_ = (auVar29._0_2_ - *puVar1) + auVar41._0_2_;
      auVar43._2_2_ = (auVar29._2_2_ - puVar1[1]) + auVar41._2_2_;
      auVar43._4_2_ = (auVar29._4_2_ - puVar1[2]) + auVar41._4_2_;
      auVar43._6_2_ = (auVar29._6_2_ - puVar1[3]) + auVar41._6_2_;
      auVar43._8_2_ = (auVar29._8_2_ - puVar1[4]) + auVar41._8_2_;
      auVar43._10_2_ = (auVar29._10_2_ - puVar1[5]) + auVar41._10_2_;
      auVar43._12_2_ = (auVar29._12_2_ - puVar1[6]) + auVar41._12_2_;
      auVar43._14_2_ = (auVar29._14_2_ - puVar1[7]) + auVar41._14_2_;
      in_XMM6 = pmaddwd(auVar43,auVar43);
      auVar41._0_4_ = auVar26._0_4_ + in_XMM6._0_4_;
      auVar41._4_4_ = auVar26._4_4_ + in_XMM6._4_4_;
      auVar41._8_4_ = auVar26._8_4_ + in_XMM6._8_4_;
      auVar41._12_4_ = auVar26._12_4_ + in_XMM6._12_4_;
      lVar12 = lVar12 + 8;
      puVar16 = puVar16 + 8;
      piVar18 = piVar18 + 8;
      puVar14 = puVar14 + 8;
      auVar26 = auVar41;
    }
    in_XMM6 = pmovzxdq(in_XMM6,auVar26);
    for (; lVar12 < width; lVar12 = lVar12 + 1) {
      lVar13 = (long)(int)(((uint)*puVar14 - (uint)*puVar16) +
                          ((int)((*piVar18 + (uint)*puVar14 * -0x10) * iVar15 + 0x400) >> 0xb));
      lVar9 = lVar9 + lVar13 * lVar13;
      puVar16 = puVar16 + 1;
      piVar18 = piVar18 + 1;
      puVar14 = puVar14 + 1;
    }
    lVar21 = lVar21 + in_XMM6._0_8_ + (ulong)auVar26._8_4_;
    lVar22 = lVar22 + in_XMM6._8_8_ + (ulong)auVar26._12_4_;
    flt0 = flt0 + flt0_stride;
    puVar20 = puVar20 + dat_stride;
    puVar17 = puVar17 + src_stride;
  }
LAB_0039ed29:
  return lVar22 + lVar21 + lVar9;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));
  __m128i sum64 = _mm_setzero_si128();
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {  // Both filters are enabled
    const __m128i xq0 = _mm_set1_epi32(xq[0]);
    const __m128i xq1 = _mm_set1_epi32(xq[1]);

    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        // Load 8x pixels from source image
        const __m128i s0 = xx_loadu_128(src + j);
        // s0 = [7 6 5 4 3 2 1 0] as i16 (indices of src[])

        // Load 8x pixels from corrupted image
        const __m128i d0 = xx_loadu_128(dat + j);
        // d0 = [7 6 5 4 3 2 1 0] as i16 (indices of dat[])

        // Shift each pixel value up by SGRPROJ_RST_BITS
        const __m128i u0 = _mm_slli_epi16(d0, SGRPROJ_RST_BITS);

        // Split u0 into two halves and pad each from u16 to i32
        const __m128i u0l = _mm_cvtepu16_epi32(u0);
        const __m128i u0h = _mm_cvtepu16_epi32(_mm_srli_si128(u0, 8));
        // u0h = [7 6 5 4] as i32, u0l = [3 2 1 0] as i32, all dat[] indices

        // Load 8 pixels from first and second filtered images
        const __m128i flt0l = xx_loadu_128(flt0 + j);
        const __m128i flt0h = xx_loadu_128(flt0 + j + 4);
        const __m128i flt1l = xx_loadu_128(flt1 + j);
        const __m128i flt1h = xx_loadu_128(flt1 + j + 4);
        // flt0 = [7 6 5 4] [3 2 1 0] as i32 (indices of flt0+j)
        // flt1 = [7 6 5 4] [3 2 1 0] as i32 (indices of flt1+j)

        // Subtract shifted corrupt image from each filtered image
        // This gives our two basis vectors for the projection
        const __m128i flt0l_subu = _mm_sub_epi32(flt0l, u0l);
        const __m128i flt0h_subu = _mm_sub_epi32(flt0h, u0h);
        const __m128i flt1l_subu = _mm_sub_epi32(flt1l, u0l);
        const __m128i flt1h_subu = _mm_sub_epi32(flt1h, u0h);
        // flt?h_subu = [ f[7]-u[7] f[6]-u[6] f[5]-u[5] f[4]-u[4] ] as i32
        // flt?l_subu = [ f[3]-u[3] f[2]-u[2] f[1]-u[1] f[0]-u[0] ] as i32

        // Multiply each basis vector by the corresponding coefficient
        const __m128i v0l = _mm_mullo_epi32(flt0l_subu, xq0);
        const __m128i v0h = _mm_mullo_epi32(flt0h_subu, xq0);
        const __m128i v1l = _mm_mullo_epi32(flt1l_subu, xq1);
        const __m128i v1h = _mm_mullo_epi32(flt1h_subu, xq1);

        // Add together the contribution from each scaled basis vector
        const __m128i vl = _mm_add_epi32(v0l, v1l);
        const __m128i vh = _mm_add_epi32(v0h, v1h);

        // Right-shift v with appropriate rounding
        const __m128i vrl = _mm_srai_epi32(_mm_add_epi32(vl, rounding), shift);
        const __m128i vrh = _mm_srai_epi32(_mm_add_epi32(vh, rounding), shift);

        // Saturate each i32 value to i16 and combine lower and upper halves
        const __m128i vr = _mm_packs_epi32(vrl, vrh);

        // Add twin-subspace-sgr-filter to corrupt image then subtract source
        const __m128i e0 = _mm_sub_epi16(_mm_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(e0, e0);

        sum32 = _mm_add_epi32(sum32, err0);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 8)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {  // Only one filter enabled
    const int32_t xq_on = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m128i xq_active = _mm_set1_epi32(xq_on);
    const __m128i xq_inactive =
        _mm_set1_epi32(-xq_on * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        // Load 8x pixels from source image
        const __m128i s0 = xx_loadu_128(src + j);
        // s0 = [7 6 5 4 3 2 1 0] as u16 (indices of src[])

        // Load 8x pixels from corrupted image and pad each u16 to i32
        const __m128i d0 = xx_loadu_128(dat + j);
        const __m128i d0h = _mm_cvtepu16_epi32(_mm_srli_si128(d0, 8));
        const __m128i d0l = _mm_cvtepu16_epi32(d0);
        // d0h, d0l = [7 6 5 4], [3 2 1 0] as u32 (indices of dat[])

        // Load 8 pixels from the filtered image
        const __m128i flth = xx_loadu_128(flt + j + 4);
        const __m128i fltl = xx_loadu_128(flt + j);
        // flth, fltl = [7 6 5 4], [3 2 1 0] as i32 (indices of flt+j)

        const __m128i flth_xq = _mm_mullo_epi32(flth, xq_active);
        const __m128i fltl_xq = _mm_mullo_epi32(fltl, xq_active);
        const __m128i d0h_xq = _mm_mullo_epi32(d0h, xq_inactive);
        const __m128i d0l_xq = _mm_mullo_epi32(d0l, xq_inactive);

        const __m128i vh = _mm_add_epi32(flth_xq, d0h_xq);
        const __m128i vl = _mm_add_epi32(fltl_xq, d0l_xq);
        // vh = [ xq0(f[7]-d[7]) xq0(f[6]-d[6]) xq0(f[5]-d[5]) xq0(f[4]-d[4]) ]
        // vl = [ xq0(f[3]-d[3]) xq0(f[2]-d[2]) xq0(f[1]-d[1]) xq0(f[0]-d[0]) ]

        // Shift this down with appropriate rounding
        const __m128i vrh = _mm_srai_epi32(_mm_add_epi32(vh, rounding), shift);
        const __m128i vrl = _mm_srai_epi32(_mm_add_epi32(vl, rounding), shift);

        // Saturate vr0 and vr1 from i32 to i16 then pack together
        const __m128i vr = _mm_packs_epi32(vrl, vrh);

        // Subtract twin-subspace-sgr filtered from source image to get error
        const __m128i e0 = _mm_sub_epi16(_mm_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(e0, e0);

        sum32 = _mm_add_epi32(sum32, err0);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 8)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_on * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
    }
  } else {  // Neither filter is enabled
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 16; j += 16) {
        // Load 2x8 u16 from source image
        const __m128i s0 = xx_loadu_128(src + j);
        const __m128i s1 = xx_loadu_128(src + j + 8);
        // Load 2x8 u16 from corrupted image
        const __m128i d0 = xx_loadu_128(dat + j);
        const __m128i d1 = xx_loadu_128(dat + j + 8);

        // Subtract corrupted image from source image
        const __m128i diff0 = _mm_sub_epi16(d0, s0);
        const __m128i diff1 = _mm_sub_epi16(d1, s1);

        // Square error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(diff0, diff0);
        const __m128i err1 = _mm_madd_epi16(diff1, diff1);

        sum32 = _mm_add_epi32(sum32, err0);
        sum32 = _mm_add_epi32(sum32, err1);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels (modulu 8)
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  // Sum 4 values from sum64l and sum64h into err
  int64_t sum[2];
  xx_storeu_128(sum, sum64);
  err += sum[0] + sum[1];
  return err;
}